

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O0

Status * __thiscall
draco::StlEncoder::EncodeToBuffer(StlEncoder *this,Mesh *mesh,EncoderBuffer *out_buffer)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  Status *in_RDI;
  Status *s;
  StlEncoder *in_stack_00000398;
  
  in_RSI[2] = in_RDX;
  *in_RSI = in_RCX;
  EncodeInternal(in_stack_00000398);
  in_RSI[2] = 0;
  in_RSI[1] = 0;
  *in_RSI = 0;
  return in_RDI;
}

Assistant:

Status StlEncoder::EncodeToBuffer(const Mesh &mesh, EncoderBuffer *out_buffer) {
  in_mesh_ = &mesh;
  out_buffer_ = out_buffer;
  Status s = EncodeInternal();
  in_mesh_ = nullptr;  // cleanup
  in_point_cloud_ = nullptr;
  out_buffer_ = nullptr;
  return s;
}